

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

void __thiscall Analyzer::checkUnutilizedResult(Analyzer *this,Node *node)

{
  TokenType TVar1;
  Node *pNVar2;
  long lVar3;
  bool bVar4;
  NodeType NVar5;
  char *name;
  Token *tok;
  char *text_id;
  CompilationContext *this_00;
  
  if (node == (Node *)0x0) {
    return;
  }
  NVar5 = node->nodeType;
  if (NVar5 - PNT_INTEGER < 4) {
    this_00 = this->ctx;
    tok = node->tok;
  }
  else {
    if (NVar5 == PNT_FUNCTION_CALL) {
      pNVar2 = *(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pNVar2->nodeType != PNT_IDENTIFIER) {
LAB_00125f96:
        NVar5 = node->nodeType;
        goto LAB_00125f9a;
      }
      name = (pNVar2->tok->u).s;
      bVar4 = nameLooksLikeResultMustBeUtilised(this,name);
      if ((!bVar4) || (bVar4 = isWatchedVariable(this,name), bVar4)) goto LAB_00125f96;
LAB_00126041:
      this_00 = this->ctx;
      tok = node->tok;
      text_id = "named-like-should-return";
      goto LAB_00126032;
    }
LAB_00125f9a:
    if (((NVar5 == PNT_FUNCTION_CALL) &&
        (pNVar2 = *(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start, pNVar2->nodeType - PNT_ACCESS_MEMBER < 2)) &&
       (lVar3 = *(long *)(*(long *)&(pNVar2->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data + 8), *(int *)(lVar3 + 0x10) == 6)) {
      name = *(char **)(*(long *)(lVar3 + 8) + 0x10);
      bVar4 = nameLooksLikeResultMustBeUtilised(this,name);
      if ((bVar4) && (bVar4 = isWatchedVariable(this,name), !bVar4)) goto LAB_00126041;
    }
    NVar5 = node->nodeType;
    if (PNT_ACCESS_MEMBER_IF_NOT_NULL < NVar5) {
      return;
    }
    if ((0x61a040U >> (NVar5 & PNT_INEXPR_VAR_DECLARATOR) & 1) == 0) {
      return;
    }
    tok = node->tok;
    TVar1 = tok->type;
    switch(TVar1) {
    case TK_PLUS:
    case TK_MINUS:
    case TK_MUL:
    case TK_DIV:
    case TK_NOT:
    case TK_INV:
    case TK_BITXOR:
    case TK_BITOR:
    case TK_BITAND:
    case TK_LS:
    case TK_GT:
    case TK_EQ:
    case TK_NE:
    case TK_LE:
    case TK_GE:
    case TK_AND:
    case TK_OR:
    case TK_MODULO:
    case TK_SHIFTL:
    case TK_SHIFTR:
    case TK_USHIFTR:
    case TK_3WAYSCMP:
    case TK_QMARK:
    case TK_IN:
    case TK_CLONE:
    case TK_TYPEOF:
      break;
    case TK_AT:
    case TK_DOUBLE_COLON:
    case TK_PLUSPLUS:
    case TK_MINUSMINUS:
    case TK_LBRACE:
    case TK_RBRACE:
    case TK_LSQUARE:
    case TK_RSQUARE:
    case TK_LPAREN:
    case TK_RPAREN:
    case TK_NEWSLOT:
    case TK_PLUSEQ:
    case TK_MINUSEQ:
    case TK_MULEQ:
    case TK_DIVEQ:
    case TK_MODEQ:
    case TK_VARPARAMS:
    case TK_COLON:
    case TK_SEMICOLON:
    case TK_NULLCOALESCE:
    case TK_NULLGETSTR:
    case TK_NULLGETOBJ:
    case TK_NULLCALL:
    case TK_NULL:
    case TK_TRUE:
    case TK_FALSE:
    case TK_BASE:
    case TK_DELETE:
    case TK_SWITCH:
    case TK_IF:
    case TK_ELSE:
    case TK_FOR:
    case TK_FOREACH:
    case TK_WHILE:
    case TK_DO:
    case TK_BREAK:
    case TK_LOCAL:
    case TK_FUNCTION:
    case TK_RETURN:
switchD_00126014_caseD_13:
      if (PNT_ACCESS_MEMBER_IF_NOT_NULL < NVar5) {
        return;
      }
      if ((0x600040U >> (NVar5 & PNT_INEXPR_VAR_DECLARATOR) & 1) == 0) {
        return;
      }
      break;
    default:
      if ((TVar1 != TK_INSTANCEOF) && (TVar1 != TK_NOTIN)) goto switchD_00126014_caseD_13;
    }
    this_00 = this->ctx;
  }
  name = "???";
  text_id = "result-not-utilized";
LAB_00126032:
  CompilationContext::warning(this_00,text_id,tok,name,"???","???","???");
  return;
}

Assistant:

void checkUnutilizedResult(Node * node)
  {
    if (!node)
      return;

    if (node->nodeType == PNT_FLOAT || node->nodeType == PNT_INTEGER || node->nodeType == PNT_BOOL ||
      node->nodeType == PNT_STRING)
    {
      ctx.warning("result-not-utilized", node->tok);
      return;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * functionName = node->children[0]->tok.u.s;
      if (nameLooksLikeResultMustBeUtilised(functionName))
      {
        if (!isWatchedVariable(functionName))
        {
          ctx.warning("named-like-should-return", node->tok, functionName);
          return;
        }
      }
    }

    if (node->nodeType == PNT_FUNCTION_CALL &&
      (node->children[0]->nodeType == PNT_ACCESS_MEMBER || node->children[0]->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL) &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * functionName = node->children[0]->children[1]->tok.u.s;
      if (nameLooksLikeResultMustBeUtilised(functionName))
      {
        if (!isWatchedVariable(functionName))
        {
          ctx.warning("named-like-should-return", node->tok, functionName);
          return;
        }
      }
    }

    if (node->nodeType == PNT_BINARY_OP || node->nodeType == PNT_TERNARY_OP ||
      node->nodeType == PNT_UNARY_PRE_OP || node->nodeType == PNT_IDENTIFIER ||
      node->nodeType == PNT_ACCESS_MEMBER || node->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
    {
      TokenType t = node->tok.type;
      if (t == TK_3WAYSCMP || t == TK_AND || t == TK_OR || t == TK_IN || t == TK_NOTIN || t == TK_EQ || t == TK_NE || t == TK_LE ||
        t == TK_LS || t == TK_GT || t == TK_GE || t == TK_NOT || t == TK_INV || t == TK_BITAND || t == TK_BITOR ||
        t == TK_BITXOR || t == TK_DIV || t == TK_MODULO || t == TK_INSTANCEOF || t == TK_QMARK || t == TK_MINUS ||
        t == TK_PLUS || t == TK_MUL || t == TK_SHIFTL || t == TK_SHIFTR || t == TK_USHIFTR || t == TK_TYPEOF ||
        t == TK_CLONE ||
        node->nodeType == PNT_IDENTIFIER || node->nodeType == PNT_ACCESS_MEMBER ||
        node->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
      {
        ctx.warning("result-not-utilized", node->tok);
      }
    }
  }